

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O1

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parseExpression(Parser *this,Precedence prec)

{
  undefined7 in_register_00000031;
  unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> primary;
  Lexer *local_40;
  Lexer *local_38;
  _Head_base<0UL,_pfederc::Capabilities_*,_false> local_30;
  
  caps = (unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
         CONCAT71(in_register_00000031,prec);
  local_30._M_head_impl = (Capabilities *)0x0;
  parsePrimary((Parser *)&stack0xffffffffffffffc0,caps);
  std::unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>::~unique_ptr
            ((unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *)
             &stack0xffffffffffffffd0);
  if (local_40 == (Lexer *)0x0) {
    Lexer::next((Lexer *)(caps->_M_t).
                         super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                         .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
    this->lexer = (Lexer *)0x0;
  }
  else {
    local_38 = local_40;
    local_40 = (Lexer *)0x0;
    parseBinary(this,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)caps,
                (Precedence)&stack0xffffffffffffffc8);
    if (local_38 != (Lexer *)0x0) {
      (*local_38->_vptr_Lexer[1])();
    }
    local_38 = (Lexer *)0x0;
  }
  if (local_40 != (Lexer *)0x0) {
    (*local_40->_vptr_Lexer[1])();
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseExpression(Precedence prec) noexcept {
  auto primary = parsePrimary();
  if (!primary) {
    lexer.next();
    /*generateError(std::make_unique<SyntaxError>(LVL_ERROR,
      SyntaxErrorCode::STX_ERR_EXPECTED_EXPR, lexer.getCurrentToken()->getPosition()));*/
    return nullptr; // error forwarding
  }
  
  return parseBinary(std::move(primary), prec);
}